

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_relational_Test::~expr_relational_Test(expr_relational_Test *this)

{
  expr_relational_Test *this_local;
  
  ~expr_relational_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, relational) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");

    auto &var1 = mod.var("a", 2);
    auto &var2 = mod.var("b", 2);
    auto &exp = var1 >= var2;
    EXPECT_EQ(exp.width(), 1);
}